

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int xmlHashGrow(xmlHashTablePtr hash,uint size)

{
  uint uVar1;
  xmlHashEntry *pxVar2;
  size_t __n;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  xmlChar *pxVar6;
  xmlHashEntry *__s;
  xmlHashEntry *pxVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  xmlHashEntry *pxVar12;
  
  __n = (ulong)size * 0x28;
  __s = (xmlHashEntry *)(*xmlMalloc)(__n);
  if (__s == (xmlHashEntry *)0x0) {
    iVar8 = -1;
  }
  else {
    iVar8 = 0;
    memset(__s,0,__n);
    uVar1 = hash->size;
    if ((ulong)uVar1 != 0) {
      pxVar2 = hash->table;
      uVar9 = pxVar2->hashValue;
      pxVar7 = pxVar2;
      while (uVar9 != 0) {
        pxVar7 = pxVar7 + 1;
        if (pxVar2 + uVar1 <= pxVar7) {
          pxVar7 = pxVar2;
        }
        uVar9 = pxVar7->hashValue;
      }
      uVar9 = 1;
      if (1 < uVar1) {
        uVar9 = uVar1;
      }
      uVar10 = 0;
      do {
        if (pxVar7->hashValue != 0) {
          uVar11 = pxVar7->hashValue & size - 1;
          pxVar12 = __s + uVar11;
          uVar11 = __s[uVar11].hashValue;
          while (uVar11 != 0) {
            pxVar12 = pxVar12 + 1;
            if (__s + size <= pxVar12) {
              pxVar12 = __s;
            }
            uVar11 = pxVar12->hashValue;
          }
          pxVar12->payload = pxVar7->payload;
          uVar11 = pxVar7->hashValue;
          uVar3 = *(undefined4 *)&pxVar7->field_0x4;
          uVar4 = *(undefined4 *)&pxVar7->key;
          uVar5 = *(undefined4 *)((long)&pxVar7->key + 4);
          pxVar6 = pxVar7->key3;
          pxVar12->key2 = pxVar7->key2;
          pxVar12->key3 = pxVar6;
          pxVar12->hashValue = uVar11;
          *(undefined4 *)&pxVar12->field_0x4 = uVar3;
          *(undefined4 *)&pxVar12->key = uVar4;
          *(undefined4 *)((long)&pxVar12->key + 4) = uVar5;
        }
        pxVar7 = pxVar7 + 1;
        if (pxVar2 + uVar1 <= pxVar7) {
          pxVar7 = hash->table;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9);
      (*xmlFree)(hash->table);
    }
    hash->table = __s;
    hash->size = size;
  }
  return iVar8;
}

Assistant:

static int
xmlHashGrow(xmlHashTablePtr hash, unsigned size) {
    const xmlHashEntry *oldentry, *oldend, *end;
    xmlHashEntry *table;
    unsigned oldsize, i;

    /* Add 0 to avoid spurious -Wtype-limits warning on 64-bit GCC */
    if ((size_t) size + 0 > SIZE_MAX / sizeof(table[0]))
        return(-1);
    table = xmlMalloc(size * sizeof(table[0]));
    if (table == NULL)
        return(-1);
    memset(table, 0, size * sizeof(table[0]));

    oldsize = hash->size;
    if (oldsize == 0)
        goto done;

    oldend = &hash->table[oldsize];
    end = &table[size];

    /*
     * Robin Hood sorting order is maintained if we
     *
     * - compute hash indices with modulo
     * - resize by an integer factor
     * - start to copy from the beginning of a probe sequence
     */
    oldentry = hash->table;
    while (oldentry->hashValue != 0) {
        if (++oldentry >= oldend)
            oldentry = hash->table;
    }

    for (i = 0; i < oldsize; i++) {
        if (oldentry->hashValue != 0) {
            xmlHashEntry *entry = &table[oldentry->hashValue & (size - 1)];

            while (entry->hashValue != 0) {
                if (++entry >= end)
                    entry = table;
            }
            *entry = *oldentry;
        }

        if (++oldentry >= oldend)
            oldentry = hash->table;
    }

    xmlFree(hash->table);

done:
    hash->table = table;
    hash->size = size;

    return(0);
}